

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

void predict_or_learn<true,false,false,false>(oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint64_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  ostream *poVar9;
  uint uVar10;
  uint uVar11;
  polyprediction *ppVar12;
  ulong uVar13;
  float fVar14;
  uint64_t uVar15;
  stringstream outputStringStream;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  uVar4 = (ec->l).multi.label;
  fVar2 = (ec->l).simple.weight;
  if (((ulong)uVar4 == 0) || ((uVar4 != 0xffffffff && (o->k < (ulong)uVar4)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is not in {1,",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar5 = o->k;
  ppVar12 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    if (uVar5 != 0) {
      uVar15 = uVar5;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar14 = (ec->pred).scalar;
        fVar3 = *(float *)((long)&ec->pred + 4);
        uVar6 = *(undefined4 *)((long)&ec->pred + 8);
        uVar7 = *(undefined4 *)((long)&ec->pred + 0xc);
        sVar8 = (ec->pred).scalars.erase_count;
        (ppVar12->scalars).end_array = (ec->pred).scalars.end_array;
        (ppVar12->scalars).erase_count = sVar8;
        ppVar12->scalar = fVar14;
        *(float *)((long)&(ppVar12->scalars)._begin + 4) = fVar3;
        *(undefined4 *)&(ppVar12->scalars)._end = uVar6;
        *(undefined4 *)((long)&(ppVar12->scalars)._end + 4) = uVar7;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        ppVar12 = ppVar12 + 1;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)((int)uVar5 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar5,
               *(undefined8 *)(base + 0xe0),ppVar12,1);
  }
  fVar14 = 1.4013e-45;
  if (1 < o->k) {
    fVar14 = 1.4013e-45;
    uVar11 = 3;
    do {
      fVar3 = o->pred[uVar11 - 2].scalar;
      ppVar12 = o->pred + ((int)fVar14 - 1);
      if (ppVar12->scalar <= fVar3 && fVar3 != ppVar12->scalar) {
        fVar14 = (float)(uVar11 - 1);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= o->k);
  }
  if ((ec->passthrough != (features *)0x0) && (o->k != 0)) {
    uVar13 = 1;
    uVar11 = 2;
    do {
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,o->pred[uVar11 - 2].scalar,uVar13 ^ 0x398d9fda640553);
      }
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar13 <= o->k);
  }
  if (o->k != 0) {
    uVar11 = 0;
    do {
      (ec->l).simple.label = *(float *)(&DAT_00277aa0 + (ulong)(uVar4 - 1 == uVar11) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
      (ec->pred).scalar = o->pred[uVar11].scalar;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uVar11 * *(int *)(base + 0xe0));
      (**(code **)(base + 0x38))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(*(int *)(base + 0xe0) * uVar11);
      uVar10 = uVar11 + 2;
      uVar11 = uVar11 + 1;
    } while ((ulong)uVar10 <= o->k);
  }
  (ec->pred).scalar = fVar14;
  (ec->l).multi.label = uVar4;
  (ec->l).simple.weight = fVar2;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}